

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1556.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  headerinfo info;
  undefined8 local_20;
  
  local_20 = 0;
  iVar1 = curl_global_init(3);
  uVar5 = _stderr;
  if (iVar1 != 0) {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar5,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1556.c"
                  ,0x34,iVar1,uVar2);
    return iVar1;
  }
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1556.c"
                  ,0x36);
    iVar1 = 0x7c;
  }
  else {
    iVar1 = curl_easy_setopt(lVar3,0x4e6f,header);
    uVar5 = _stderr;
    if (iVar1 == 0) {
      iVar1 = curl_easy_setopt(lVar3,0x272d,&local_20);
      uVar5 = _stderr;
      if (iVar1 == 0) {
        iVar1 = curl_easy_setopt(lVar3,0x29,1);
        uVar5 = _stderr;
        if (iVar1 == 0) {
          iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
          uVar5 = _stderr;
          if (iVar1 == 0) {
            iVar1 = curl_easy_perform(lVar3);
            uVar5 = _stderr;
            if (iVar1 == 0) {
              iVar1 = 0;
              curl_mprintf("Max: %ld\n",local_20);
            }
            else {
              uVar2 = curl_easy_strerror(iVar1);
              curl_mfprintf(uVar5,"%s:%d curl_easy_perform() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1556.c"
                            ,0x41,iVar1,uVar2);
              iVar1 = 0x7e;
            }
            goto LAB_001023d1;
          }
          uVar2 = curl_easy_strerror(iVar1);
          uVar4 = 0x3b;
        }
        else {
          uVar2 = curl_easy_strerror(iVar1);
          uVar4 = 0x3a;
        }
      }
      else {
        uVar2 = curl_easy_strerror(iVar1);
        uVar4 = 0x39;
      }
    }
    else {
      uVar2 = curl_easy_strerror(iVar1);
      uVar4 = 0x38;
    }
    curl_mfprintf(uVar5,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/lib1556.c"
                  ,uVar4,iVar1,uVar2);
  }
LAB_001023d1:
  curl_easy_cleanup(lVar3);
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURLcode code;
  CURL *curl = NULL;
  int res = 0;
  struct headerinfo info = {0};

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_HEADERFUNCTION, header);
  easy_setopt(curl, CURLOPT_HEADERDATA, &info);
  easy_setopt(curl, CURLOPT_VERBOSE, 1L);
  easy_setopt(curl, CURLOPT_URL, URL);

  code = curl_easy_perform(curl);
  if(CURLE_OK != code) {
    fprintf(stderr, "%s:%d curl_easy_perform() failed, "
            "with code %d (%s)\n",
            __FILE__, __LINE__, (int)code, curl_easy_strerror(code));
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }

  printf("Max: %ld\n", (long)info.largest);

test_cleanup:

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}